

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

uint8 __thiscall rw::ColorQuant::findColor(ColorQuant *this,RGBA color)

{
  uint32 addr;
  Node *pNVar1;
  
  addr = makeTreeAddr(color);
  pNVar1 = findNode(this,this->root,addr,8);
  return (uint8)pNVar1->numPixels;
}

Assistant:

uint8
ColorQuant::findColor(RGBA color)
{
	uint32 addr = makeTreeAddr(color);
	ColorQuant::Node *node = this->findNode(root, addr, QUANTDEPTH);
	return node->numPixels;
}